

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::cpp::Int64ToString_abi_cxx11_
          (string *__return_storage_ptr__,cpp *this,int64 number)

{
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  allocator<char> local_19;
  cpp *local_18;
  int64 number_local;
  
  local_18 = this;
  number_local = (int64)__return_storage_ptr__;
  if (this == (cpp *)0x8000000000000000) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"GOOGLE_LONGLONG(~0x7fffffffffffffff)",&local_19);
    std::allocator<char>::~allocator(&local_19);
  }
  else {
    SimpleItoa_abi_cxx11_(&local_70,(protobuf *)this,number);
    std::operator+(&local_50,"GOOGLE_LONGLONG(",&local_70);
    std::operator+(__return_storage_ptr__,&local_50,")");
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
  }
  return __return_storage_ptr__;
}

Assistant:

string Int64ToString(int64 number) {
  // gcc rejects the decimal form of kint64min
  if (number == kint64min) {
    // Make sure we are in a 2's complement system.
    GOOGLE_COMPILE_ASSERT(kint64min == GOOGLE_LONGLONG(~0x7fffffffffffffff),
                   kint64min_value_error);
    return "GOOGLE_LONGLONG(~0x7fffffffffffffff)";
  }
  return "GOOGLE_LONGLONG(" + SimpleItoa(number) + ")";
}